

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int take_off(void)

{
  ulong uVar1;
  obj *poVar2;
  obj *poVar3;
  obj *poVar4;
  obj *poVar5;
  obj *poVar6;
  obj *poVar7;
  obj *poVar8;
  int iVar9;
  char *pcVar10;
  obj **ppoVar11;
  long lVar12;
  obj *poVar13;
  
  poVar13 = uarm;
  poVar8 = uarmu;
  poVar7 = uarmc;
  poVar6 = uarmh;
  poVar5 = uarms;
  poVar4 = uarmg;
  poVar3 = uarmf;
  poVar2 = uamul;
  if (taking_off != 0) {
    if (0 < todelay) {
      todelay = todelay + -1;
      return 1;
    }
    switch(taking_off) {
    case 1:
      iVar9 = cursed(uarm);
      if (iVar9 == 0) {
        Armor_off();
      }
      break;
    case 2:
      iVar9 = cursed(uarmc);
      poVar13 = poVar7;
      if (iVar9 == 0) {
        Cloak_off();
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_00185363_caseD_3:
      warning("do_takeoff: taking off %lx");
      goto LAB_0018550d;
    case 4:
      iVar9 = cursed(uarmh);
      poVar13 = poVar6;
      if (iVar9 == 0) {
        Helmet_off();
      }
      break;
    case 8:
      iVar9 = cursed(uarms);
      poVar13 = poVar5;
      if (iVar9 == 0) {
        Shield_off();
      }
      break;
    default:
      if (taking_off == 0x10) {
        iVar9 = cursed(uarmg);
        poVar13 = poVar4;
        if (iVar9 == 0) {
          Gloves_off();
        }
        break;
      }
      if (taking_off == 0x20) {
        iVar9 = cursed(uarmf);
        poVar13 = poVar3;
        if (iVar9 == 0) {
          Boots_off();
        }
        break;
      }
      if (taking_off == 0x40) {
        iVar9 = cursed(uarmu);
        poVar13 = poVar8;
        if (iVar9 == 0) {
          Shirt_off();
        }
        break;
      }
      if (taking_off == 0x80000) {
        iVar9 = cursed(ublindf);
        if (iVar9 == 0) {
          Blindf_off(ublindf,'\x01');
        }
      }
      else if (taking_off == 0x200) {
        setuqwep((obj *)0x0);
        pline("You no longer have ammunition readied.");
      }
      else {
        if (taking_off != 0x400) {
          if (taking_off == 0x10000) {
            iVar9 = cursed(uamul);
            poVar13 = poVar2;
            if (iVar9 == 0) {
              Amulet_off();
            }
            break;
          }
          if (taking_off == 0x20000) {
            ppoVar11 = &uleft;
          }
          else {
            if (taking_off != 0x40000) {
              if (taking_off != 0x100) goto switchD_00185363_caseD_3;
              iVar9 = cursed(uwep);
              if (iVar9 != 0) goto LAB_0018550d;
              setuwep((obj *)0x0);
              pcVar10 = body_part(7);
              pline("You are empty %s.",pcVar10);
              goto LAB_001854cf;
            }
            ppoVar11 = &uright;
          }
          poVar13 = *ppoVar11;
          iVar9 = cursed(poVar13);
          if (iVar9 == 0) {
            Ring_off(*ppoVar11);
          }
          break;
        }
        setuswapwep((obj *)0x0);
        pline("You no longer have a second weapon readied.");
LAB_001854cf:
        u.twoweap = '\0';
      }
      goto LAB_0018550d;
    }
    if (poVar13 != (obj *)0x0) {
      off_msg(poVar13,'\x01');
    }
LAB_0018550d:
    takeoff_mask = ~taking_off & takeoff_mask;
    taking_off = 0;
  }
  lVar12 = 0;
  do {
    if (lVar12 == 0x70) goto switchD_00185616_caseD_0;
    uVar1 = *(ulong *)((long)takeoff_order + lVar12);
    lVar12 = lVar12 + 8;
  } while ((takeoff_mask & uVar1) == 0);
  todelay = 0;
  taking_off = uVar1;
  switch(uVar1) {
  case 0:
switchD_00185616_caseD_0:
    todelay = 0;
    pline("You finish %s.",disrobing);
    return 0;
  case 1:
    poVar13 = uarm;
    if (uarmc != (obj *)0x0) {
      iVar9 = objects[uarmc->otyp].oc_delay * 2;
LAB_00185771:
      todelay = iVar9 + 1;
    }
    goto LAB_00185697;
  case 2:
    ppoVar11 = &uarmc;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_00185616_caseD_3:
    warning("take_off: taking off %lx");
    return 0;
  case 4:
    ppoVar11 = &uarmh;
    break;
  case 8:
    ppoVar11 = &uarms;
    break;
  default:
    if (uVar1 == 0x10) {
      ppoVar11 = &uarmg;
      break;
    }
    if (uVar1 == 0x20) {
      ppoVar11 = &uarmf;
      break;
    }
    if (uVar1 == 0x40) {
      if (uarm != (obj *)0x0) {
        todelay = objects[uarm->otyp].oc_delay * 2;
      }
      poVar13 = uarmu;
      if (uarmc != (obj *)0x0) {
        iVar9 = todelay + objects[uarmc->otyp].oc_delay * 2;
        goto LAB_00185771;
      }
      goto LAB_00185697;
    }
    iVar9 = 1;
    if ((((uVar1 != 0x100) && (uVar1 != 0x200)) && (uVar1 != 0x400)) &&
       (((uVar1 != 0x10000 && (uVar1 != 0x20000)) && (uVar1 != 0x40000)))) {
      if (uVar1 != 0x80000) goto switchD_00185616_caseD_3;
      iVar9 = 2;
    }
    goto LAB_001856c0;
  }
  poVar13 = *ppoVar11;
LAB_00185697:
  if (poVar13 != (obj *)0x0) {
    todelay = todelay + objects[poVar13->otyp].oc_delay;
  }
  iVar9 = todelay;
  if (0 < todelay) {
LAB_001856c0:
    todelay = iVar9 + -1;
  }
  set_occupation(take_off,disrobing,0);
  return 1;
}

Assistant:

static int take_off(void)
{
	int i;
	struct obj *otmp;

	if (taking_off) {
	    if (todelay > 0) {
		todelay--;
		return 1;	/* still busy */
	    } else {
		if ((otmp = do_takeoff())) off_msg(otmp, TRUE);
	    }
	    takeoff_mask &= ~taking_off;
	    taking_off = 0L;
	}

	for (i = 0; takeoff_order[i]; i++)
	    if (takeoff_mask & takeoff_order[i]) {
		taking_off = takeoff_order[i];
		break;
	    }

	otmp = NULL;
	todelay = 0;

	if (taking_off == 0L) {
	  pline("You finish %s.", disrobing);
	  return 0;
	} else if (taking_off == W_WEP) {
	  todelay = 1;
	} else if (taking_off == W_SWAPWEP) {
	  todelay = 1;
	} else if (taking_off == W_QUIVER) {
	  todelay = 1;
	} else if (taking_off == WORN_ARMOR) {
	  otmp = uarm;
	  /* If a cloak is being worn, add the time to take it off and put
	   * it back on again.  Kludge alert! since that time is 0 for all
	   * known cloaks, add 1 so that it actually matters...
	   */
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_CLOAK) {
	  otmp = uarmc;
	} else if (taking_off == WORN_BOOTS) {
	  otmp = uarmf;
	} else if (taking_off == WORN_GLOVES) {
	  otmp = uarmg;
	} else if (taking_off == WORN_HELMET) {
	  otmp = uarmh;
	} else if (taking_off == WORN_SHIELD) {
	  otmp = uarms;
	} else if (taking_off == WORN_SHIRT) {
	  otmp = uarmu;
	  /* add the time to take off and put back on armor and/or cloak */
	  if (uarm)  todelay += 2 * objects[uarm->otyp].oc_delay;
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_AMUL) {
	  todelay = 1;
	} else if (taking_off == LEFT_RING) {
	  todelay = 1;
	} else if (taking_off == RIGHT_RING) {
	  todelay = 1;
	} else if (taking_off == WORN_BLINDF) {
	  todelay = 2;
	} else {
	  warning("take_off: taking off %lx", taking_off);
	  return 0;	/* force done */
	}

	if (otmp) todelay += objects[otmp->otyp].oc_delay;

	/* Since setting the occupation now starts the counter next move, that
	 * would always produce a delay 1 too big per item unless we subtract
	 * 1 here to account for it.
	 */
	if (todelay > 0) todelay--;

	set_occupation(take_off, disrobing, 0);
	return 1;		/* get busy */
}